

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

void __thiscall
mp::ExprWrapper<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::ExprWrapper
          (ExprWrapper<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_> *this,
          AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->con_flat_).super_BasicConstraint.name_.field_2;
  (this->con_flat_).super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (c->super_BasicConstraint).name_._M_dataplus._M_p;
  paVar2 = &(c->super_BasicConstraint).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(c->super_BasicConstraint).name_.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->con_flat_).super_BasicConstraint.name_.field_2 + 8) = uVar4;
  }
  else {
    (this->con_flat_).super_BasicConstraint.name_._M_dataplus._M_p = pcVar3;
    (this->con_flat_).super_BasicConstraint.name_.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->con_flat_).super_BasicConstraint.name_._M_string_length =
       (c->super_BasicConstraint).name_._M_string_length;
  (c->super_BasicConstraint).name_._M_dataplus._M_p = (pointer)paVar2;
  (c->super_BasicConstraint).name_._M_string_length = 0;
  (c->super_BasicConstraint).name_.field_2._M_local_buf[0] = '\0';
  gch::detail::small_vector_base<std::allocator<double>,_6U>::move_initialize<6U,_nullptr>
            ((small_vector_base<std::allocator<double>,_6U> *)
             &(this->con_flat_).super_QuadAndLinTerms,
             (small_vector_base<std::allocator<double>,_6U> *)&c->super_QuadAndLinTerms);
  gch::detail::small_vector_base<std::allocator<int>,_6U>::move_initialize<6U,_nullptr>
            (&(this->con_flat_).super_QuadAndLinTerms.super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>,
             &(c->super_QuadAndLinTerms).super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>);
  gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
  move_initialize<8U,_nullptr>
            ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
             &(this->con_flat_).super_QuadAndLinTerms.super_QuadTerms,
             (small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
             &(c->super_QuadAndLinTerms).super_QuadTerms);
  gch::detail::small_vector_base<std::allocator<double>,_6U>::move_initialize<6U,_nullptr>
            (&(this->con_flat_).super_QuadAndLinTerms.super_QuadTerms.coefs_aux_.
              super_small_vector_base<std::allocator<double>,_6U>,
             &(c->super_QuadAndLinTerms).super_QuadTerms.coefs_aux_.
              super_small_vector_base<std::allocator<double>,_6U>);
  gch::detail::small_vector_base<std::allocator<int>,_6U>::move_initialize<6U,_nullptr>
            (&(this->con_flat_).super_QuadAndLinTerms.super_QuadTerms.vars1_aux_.
              super_small_vector_base<std::allocator<int>,_6U>,
             &(c->super_QuadAndLinTerms).super_QuadTerms.vars1_aux_.
              super_small_vector_base<std::allocator<int>,_6U>);
  gch::detail::small_vector_base<std::allocator<int>,_6U>::move_initialize<6U,_nullptr>
            (&(this->con_flat_).super_QuadAndLinTerms.super_QuadTerms.vars2_aux_.
              super_small_vector_base<std::allocator<int>,_6U>,
             &(c->super_QuadAndLinTerms).super_QuadTerms.vars2_aux_.
              super_small_vector_base<std::allocator<int>,_6U>);
  (this->con_flat_).super_AlgConRhs<0>.rhs_ = (c->super_AlgConRhs<0>).rhs_;
  return;
}

Assistant:

ExprWrapper(Con c) : con_flat_(std::move(c)) { }